

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  ZSTD_compressedBlockState_t *pZVar2;
  size_t sVar3;
  void *pvVar4;
  bool bVar5;
  ulong uVar6;
  ZSTD_customMem customMem;
  uint uVar7;
  uint uVar8;
  ZSTD_strategy ZVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ZSTD_cwksp_alloc_phase_e ZVar14;
  size_t sVar15;
  size_t sVar16;
  ZSTD_compressedBlockState_t *pZVar17;
  void *pvVar18;
  seqDef *psVar19;
  rawSeq *prVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  ulong uVar23;
  BYTE *pBVar24;
  size_t sVar25;
  ZSTD_compressedBlockState_t *pZVar26;
  ulong uVar27;
  ldmEntry_t *__s;
  uint uVar28;
  ulong maxChunkSize;
  size_t err_code;
  BYTE *pBVar29;
  ZSTD_indexResetPolicy_e local_90;
  size_t local_88;
  size_t local_80;
  
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xb0);
  params_00 = &(zc->appliedParams).ldmParams;
  if ((zc->appliedParams).ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
  }
  uVar27 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= uVar27) {
    uVar27 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    uVar27 = 1;
  }
  maxChunkSize = 0x20000;
  if (uVar27 < 0x20000) {
    maxChunkSize = uVar27;
  }
  uVar28 = ((zc->appliedParams).cParams.minMatch != 3) + 3;
  uVar6 = (maxChunkSize & 0xffffffff) / (ulong)uVar28;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      uVar23 = 0;
      if (uVar27 < 0x20000) {
        uVar23 = (ulong)(0x20000 - (uint)maxChunkSize >> 0xb);
      }
      local_88 = (maxChunkSize >> 8) + maxChunkSize + uVar23 + 1;
    }
    else {
      local_88 = 0;
    }
    local_80 = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      local_80 = uVar27 + maxChunkSize;
    }
  }
  else {
    local_88 = 0;
    local_80 = 0;
  }
  cParams = &(zc->appliedParams).cParams;
  sVar15 = ZSTD_ldm_getMaxNbSeq(*params_00,maxChunkSize);
  local_90 = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    local_90 = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  sVar16 = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (cParams,params_00,(uint)(zc->staticSize != 0),
                      (zc->appliedParams).useRowMatchFinder,local_80,local_88,pledgedSrcSize);
  if (0xffffffffffffff88 < sVar16) {
    return sVar16;
  }
  sVar3 = zc->staticSize;
  if (sVar3 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar18 = (zc->workspace).workspace;
  pvVar4 = (zc->workspace).workspaceEnd;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < sVar16 * 3) {
    bVar5 = false;
  }
  else {
    bVar5 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  if (((ulong)((long)pvVar4 - (long)pvVar18) < sVar16) || (bVar5)) {
    if (sVar3 != 0) {
      return 0xffffffffffffffc0;
    }
    customMem = zc->customMem;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x31 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    (zc->workspace).workspace = (void *)0x0;
    (zc->workspace).workspaceEnd = (void *)0x0;
    ZSTD_customFree(pvVar18,customMem);
    pZVar17 = (ZSTD_compressedBlockState_t *)ZSTD_customMalloc(sVar16,zc->customMem);
    if (pZVar17 == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    (zc->workspace).workspace = pZVar17;
    pvVar18 = (void *)((long)&(pZVar17->entropy).huf.CTable[0].val + sVar16);
    (zc->workspace).workspaceEnd = pvVar18;
    (zc->workspace).objectEnd = pZVar17;
    (zc->workspace).tableValidEnd = pZVar17;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    (zc->workspace).tableEnd = pZVar17;
    (zc->workspace).allocStart = pvVar18;
    (zc->workspace).allocFailed = '\0';
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    if ((long)sVar16 < 0x11f0) {
      (zc->workspace).allocFailed = '\x01';
      (zc->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)0x0;
      return 0xffffffffffffffc0;
    }
    pZVar2 = pZVar17 + 1;
    (zc->workspace).objectEnd = pZVar2;
    (zc->workspace).tableEnd = pZVar2;
    (zc->workspace).tableValidEnd = pZVar2;
    (zc->blockState).prevCBlock = pZVar17;
    if (sVar16 < 0x23e0) {
      (zc->workspace).allocFailed = '\x01';
      (zc->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)0x0;
      return 0xffffffffffffffc0;
    }
    pZVar26 = pZVar17 + 2;
    (zc->workspace).objectEnd = pZVar26;
    (zc->workspace).tableValidEnd = pZVar26;
    (zc->blockState).nextCBlock = pZVar2;
    if (sVar16 < 0x3db8) {
      pZVar17 = pZVar26;
      pZVar26 = (ZSTD_compressedBlockState_t *)0x0;
    }
    else {
      pZVar17 = (ZSTD_compressedBlockState_t *)(pZVar17[3].entropy.fse.matchlengthCTable + 0x38);
      (zc->workspace).objectEnd = pZVar17;
      (zc->workspace).tableValidEnd = pZVar17;
    }
    zc->entropyWorkspace = (U32 *)pZVar26;
    (zc->workspace).tableEnd = pZVar17;
    (zc->workspace).allocStart = pvVar18;
    (zc->workspace).allocFailed = '\0';
    local_90 = ZSTDirp_reset;
  }
  else {
    (zc->workspace).tableEnd = (zc->workspace).objectEnd;
    (zc->workspace).allocStart = pvVar4;
    (zc->workspace).allocFailed = '\0';
    if (ZSTD_cwksp_alloc_buffers < (zc->workspace).phase) {
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
    }
  }
  pBVar29 = &(zc->workspace).allocFailed;
  uVar10 = cParams->windowLog;
  uVar11 = cParams->chainLog;
  uVar12 = (zc->appliedParams).cParams.hashLog;
  uVar13 = (zc->appliedParams).cParams.searchLog;
  uVar7 = (zc->appliedParams).cParams.minMatch;
  uVar8 = (zc->appliedParams).cParams.targetLength;
  ZVar9 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar7;
  (zc->blockState).matchState.cParams.targetLength = uVar8;
  (zc->blockState).matchState.cParams.strategy = ZVar9;
  (zc->blockState).matchState.cParams.windowLog = uVar10;
  (zc->blockState).matchState.cParams.chainLog = uVar11;
  (zc->blockState).matchState.cParams.hashLog = uVar12;
  (zc->blockState).matchState.cParams.searchLog = uVar13;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = maxChunkSize;
  XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  pZVar17 = (zc->blockState).prevCBlock;
  pZVar17->rep[0] = 1;
  pZVar17->rep[1] = 4;
  pZVar17->rep[2] = 8;
  (pZVar17->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar17->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar17->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar17->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  if ((zc->workspace).phase == ZSTD_cwksp_alloc_objects) {
    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
  }
  pBVar22 = (BYTE *)(zc->workspace).tableEnd;
  pBVar24 = (BYTE *)(zc->workspace).allocStart;
  pBVar21 = pBVar24 + (-0x20 - maxChunkSize);
  if (pBVar21 < pBVar22) {
    *pBVar29 = '\x01';
    pBVar21 = pBVar24;
    pBVar24 = (BYTE *)0x0;
  }
  else {
    if (pBVar21 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar21;
    }
    (zc->workspace).allocStart = pBVar21;
    pBVar24 = pBVar21;
  }
  (zc->seqStore).litStart = pBVar24;
  (zc->seqStore).maxNbLit = maxChunkSize;
  zc->bufferedPolicy = zbuff;
  zc->inBuffSize = local_80;
  if (local_80 == 0) {
LAB_006cfb76:
    pBVar24 = pBVar21;
    pBVar21 = (BYTE *)0x0;
  }
  else {
    pBVar24 = pBVar21 + -local_80;
    if (pBVar24 < pBVar22) {
      *pBVar29 = '\x01';
      goto LAB_006cfb76;
    }
    if (pBVar24 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar24;
    }
    (zc->workspace).allocStart = pBVar24;
    pBVar21 = pBVar24;
  }
  zc->inBuff = (char *)pBVar21;
  zc->outBuffSize = local_88;
  if (local_88 == 0) {
LAB_006cfbb9:
    pBVar21 = (BYTE *)0x0;
  }
  else {
    pBVar21 = pBVar24 + -local_88;
    if (pBVar21 < pBVar22) {
      *pBVar29 = '\x01';
      goto LAB_006cfbb9;
    }
    if (pBVar21 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar21;
    }
    (zc->workspace).allocStart = pBVar21;
    pBVar24 = pBVar21;
  }
  zc->outBuff = (char *)pBVar21;
  if ((zc->appliedParams).ldmParams.enableLdm != 0) {
    sVar25 = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                    (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
    pBVar24 = pBVar24 + -sVar25;
    if (pBVar24 < pBVar22) {
      *pBVar29 = '\x01';
      pBVar24 = (BYTE *)0x0;
    }
    else {
      if (pBVar24 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar24;
      }
      (zc->workspace).allocStart = pBVar24;
    }
    (zc->ldmState).bucketOffsets = pBVar24;
    memset(pBVar24,0,sVar25);
  }
  if ((zc->stage == ZSTDcs_init) && (params_00->enableLdm == 0)) {
    (zc->externSeqStore).posInSequence = 0;
    (zc->externSeqStore).size = 0;
    (zc->externSeqStore).seq = (rawSeq *)0x0;
    (zc->externSeqStore).pos = 0;
    (zc->externSeqStore).capacity = 0;
  }
  (zc->seqStore).maxNbSeq = uVar6;
  ZVar14 = (zc->workspace).phase;
  if (ZVar14 == ZSTD_cwksp_alloc_objects) {
    (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
    ZVar14 = ZSTD_cwksp_alloc_buffers;
  }
  if ((uint)maxChunkSize < uVar28) {
    (zc->seqStore).llCode = (BYTE *)0x0;
    (zc->seqStore).mlCode = (BYTE *)0x0;
LAB_006cfd2b:
    pBVar22 = (BYTE *)0x0;
  }
  else {
    pBVar22 = (BYTE *)((long)(zc->workspace).allocStart - uVar6);
    if (pBVar22 < (zc->workspace).tableEnd) {
      *pBVar29 = '\x01';
      pBVar22 = (BYTE *)0x0;
    }
    else {
      if (pBVar22 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar22;
      }
      (zc->workspace).allocStart = pBVar22;
    }
    (zc->seqStore).llCode = pBVar22;
    pBVar22 = (BYTE *)((long)(zc->workspace).allocStart - uVar6);
    if (pBVar22 < (zc->workspace).tableEnd) {
      *pBVar29 = '\x01';
      pBVar22 = (BYTE *)0x0;
    }
    else {
      if (pBVar22 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar22;
      }
      (zc->workspace).allocStart = pBVar22;
    }
    (zc->seqStore).mlCode = pBVar22;
    pBVar22 = (BYTE *)((long)(zc->workspace).allocStart - uVar6);
    if (pBVar22 < (zc->workspace).tableEnd) {
      *pBVar29 = '\x01';
      goto LAB_006cfd2b;
    }
    if (pBVar22 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar22;
    }
    (zc->workspace).allocStart = pBVar22;
  }
  (zc->seqStore).ofCode = pBVar22;
  if (ZVar14 < ZSTD_cwksp_alloc_aligned) {
    pvVar18 = (zc->workspace).allocStart;
    pvVar18 = (void *)(((ulong)(uint)-(int)pvVar18 | 0xffffffffffffffc0) + (long)pvVar18);
    if (pvVar18 < (zc->workspace).tableEnd) {
LAB_006cfdf2:
      *pBVar29 = '\x01';
    }
    else {
      if (pvVar18 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pvVar18;
      }
      (zc->workspace).allocStart = pvVar18;
      pvVar18 = (zc->workspace).objectEnd;
      pvVar18 = (void *)((ulong)(-(int)pvVar18 & 0x3f) + (long)pvVar18);
      if (pvVar18 <= (zc->workspace).workspaceEnd) {
        (zc->workspace).objectEnd = pvVar18;
        (zc->workspace).tableEnd = pvVar18;
        (zc->workspace).tableValidEnd = pvVar18;
        (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_006cfdc4;
      }
    }
LAB_006cfdf6:
    psVar19 = (seqDef *)0x0;
  }
  else {
LAB_006cfdc4:
    uVar27 = uVar6 * 8 + 0x3f & 0x7ffffffc0;
    if (uVar27 == 0) goto LAB_006cfdf6;
    psVar19 = (seqDef *)((long)(zc->workspace).allocStart - uVar27);
    if (psVar19 < (seqDef *)(zc->workspace).tableEnd) goto LAB_006cfdf2;
    if (psVar19 < (seqDef *)(zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = psVar19;
    }
    (zc->workspace).allocStart = psVar19;
  }
  (zc->seqStore).sequencesStart = psVar19;
  sVar16 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,&zc->workspace,cParams,
                      (zc->appliedParams).useRowMatchFinder,crp,local_90,ZSTD_resetTarget_CCtx);
  if (0xffffffffffffff88 < sVar16) {
    return sVar16;
  }
  if (params_00->enableLdm == 0) goto LAB_006d001e;
  sVar25 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
  ZVar14 = (zc->workspace).phase;
  if (ZVar14 < ZSTD_cwksp_alloc_aligned) {
    if (ZVar14 == ZSTD_cwksp_alloc_objects) {
      (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    }
    pvVar18 = (zc->workspace).allocStart;
    pvVar18 = (void *)(((ulong)(uint)-(int)pvVar18 | 0xffffffffffffffc0) + (long)pvVar18);
    if (pvVar18 < (zc->workspace).tableEnd) {
LAB_006cfefc:
      *pBVar29 = '\x01';
    }
    else {
      if (pvVar18 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pvVar18;
      }
      (zc->workspace).allocStart = pvVar18;
      pvVar18 = (zc->workspace).objectEnd;
      pvVar18 = (void *)((ulong)(-(int)pvVar18 & 0x3f) + (long)pvVar18);
      if (pvVar18 <= (zc->workspace).workspaceEnd) {
        (zc->workspace).objectEnd = pvVar18;
        (zc->workspace).tableEnd = pvVar18;
        (zc->workspace).tableValidEnd = pvVar18;
        (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_006cfedb;
      }
    }
LAB_006cff00:
    __s = (ldmEntry_t *)0x0;
  }
  else {
LAB_006cfedb:
    uVar27 = sVar25 + 0x3f & 0xffffffffffffffc0;
    if (uVar27 == 0) goto LAB_006cff00;
    __s = (ldmEntry_t *)((long)(zc->workspace).allocStart - uVar27);
    if (__s < (ldmEntry_t *)(zc->workspace).tableEnd) goto LAB_006cfefc;
    if (__s < (ldmEntry_t *)(zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = __s;
    }
    (zc->workspace).allocStart = __s;
  }
  (zc->ldmState).hashTable = __s;
  memset(__s,0,sVar25);
  ZVar14 = (zc->workspace).phase;
  if (ZVar14 < ZSTD_cwksp_alloc_aligned) {
    if (ZVar14 == ZSTD_cwksp_alloc_objects) {
      (zc->workspace).tableValidEnd = (zc->workspace).objectEnd;
    }
    pvVar18 = (zc->workspace).allocStart;
    pvVar18 = (void *)(((ulong)(uint)-(int)pvVar18 | 0xffffffffffffffc0) + (long)pvVar18);
    if (pvVar18 < (zc->workspace).tableEnd) {
LAB_006cffc1:
      *pBVar29 = '\x01';
    }
    else {
      if (pvVar18 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pvVar18;
      }
      (zc->workspace).allocStart = pvVar18;
      pvVar18 = (zc->workspace).objectEnd;
      pvVar18 = (void *)((ulong)(-(int)pvVar18 & 0x3f) + (long)pvVar18);
      if (pvVar18 <= (zc->workspace).workspaceEnd) {
        (zc->workspace).objectEnd = pvVar18;
        (zc->workspace).tableEnd = pvVar18;
        (zc->workspace).tableValidEnd = pvVar18;
        (zc->workspace).phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_006cff98;
      }
    }
LAB_006cffc5:
    prVar20 = (rawSeq *)0x0;
  }
  else {
LAB_006cff98:
    uVar27 = sVar15 * 0xc + 0x3f & 0xffffffffffffffc0;
    if (uVar27 == 0) goto LAB_006cffc5;
    prVar20 = (rawSeq *)((long)(zc->workspace).allocStart - uVar27);
    if (prVar20 < (rawSeq *)(zc->workspace).tableEnd) goto LAB_006cffc1;
    if (prVar20 < (rawSeq *)(zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = prVar20;
    }
    (zc->workspace).allocStart = prVar20;
  }
  zc->ldmSequences = prVar20;
  zc->maxNbLdmSequences = sVar15;
  *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
  (zc->ldmState).window.base = "";
  (zc->ldmState).window.dictBase = "";
  (zc->ldmState).window.dictLimit = 1;
  (zc->ldmState).window.lowLimit = 1;
  (zc->ldmState).window.nextSrc = (BYTE *)"PK\x06\x06";
  (zc->ldmState).loadedDictEnd = 0;
LAB_006d001e:
  zc->initialized = 1;
  return 0;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_urm_auto);
    if (params->ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params->cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        /* buffers */
        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
            &zc->blockState.matchState,
            ws,
            &params->cParams,
            params->useRowMatchFinder,
            crp,
            needsIndexReset,
            ZSTD_resetTarget_CCtx), "");

        /* ldm hash table */
        if (params->ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace, resizeWorkspace));
        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));

        zc->initialized = 1;

        return 0;
    }
}